

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::BinaryLogLoss::dim_forward
          (Dim *__return_storage_ptr__,BinaryLogLoss *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  uint b;
  ostream *poVar2;
  invalid_argument *piVar3;
  initializer_list<unsigned_int> x;
  string local_1b0 [32];
  ostringstream s;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x3a9,"virtual Dim cnn::BinaryLogLoss::dim_forward(const vector<Dim> &) const");
  }
  if ((pDVar1->d[0] != 2) && (pDVar1->nd != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar2 = std::operator<<((ostream *)&s,"Bad input dimensions in BinaryLogLoss: ");
    operator<<(poVar2,xs);
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar3,local_1b0);
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((pDVar1[1].d[0] != 2) && (pDVar1[1].nd != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar2 = std::operator<<((ostream *)&s,"Bad input dimensions in BinaryLogLoss: ");
    operator<<(poVar2,xs);
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar3,local_1b0);
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  _s = 1;
  b = pDVar1[1].bd;
  if (pDVar1[1].bd < pDVar1->bd) {
    b = pDVar1->bd;
  }
  x._M_len = 1;
  x._M_array = (iterator)&s;
  Dim::Dim(__return_storage_ptr__,x,b);
  return __return_storage_ptr__;
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}